

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdpeer.cc
# Opt level: O0

bool __thiscall bdSpace::flagpeer(bdSpace *this,bdId *id,uint32_t flags,uint32_t ex_flags)

{
  bdDhtFunctions *pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  uint uVar5;
  pointer pbVar6;
  _Self local_58;
  _List_node_base *local_50;
  _List_iterator<bdPeer> local_48;
  iterator it;
  bdBucket *buck;
  int bucket;
  bdMetric met;
  uint32_t ex_flags_local;
  uint32_t flags_local;
  bdId *id_local;
  bdSpace *this_local;
  
  met.super_bdNodeId.data._12_4_ = ex_flags;
  met.super_bdNodeId.data._16_4_ = flags;
  (*this->mFns->_vptr_bdDhtFunctions[4])(this->mFns,&this->mOwnId,&id->id,(long)&buck + 4);
  buck._0_4_ = (*this->mFns->_vptr_bdDhtFunctions[6])(this->mFns,(long)&buck + 4);
  it._M_node = (_List_node_base *)
               std::vector<bdBucket,_std::allocator<bdBucket>_>::operator[]
                         (&this->buckets,(long)(int)buck);
  std::_List_iterator<bdPeer>::_List_iterator(&local_48);
  local_50 = (_List_node_base *)
             std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::begin(it._M_node);
  local_48._M_node = local_50;
  while( true ) {
    local_58._M_node =
         (_List_node_base *)std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::end(it._M_node);
    bVar4 = std::operator!=(&local_48,&local_58);
    if (!bVar4) break;
    pbVar1 = this->mFns;
    pbVar6 = std::_List_iterator<bdPeer>::operator->(&local_48);
    uVar5 = (*pbVar1->_vptr_bdDhtFunctions[7])(pbVar1,id,pbVar6);
    uVar3 = met.super_bdNodeId.data._16_4_;
    if ((uVar5 & 1) != 0) {
      pbVar6 = std::_List_iterator<bdPeer>::operator->(&local_48);
      uVar2 = met.super_bdNodeId.data._12_4_;
      pbVar6->mPeerFlags = uVar3 | pbVar6->mPeerFlags;
      pbVar6 = std::_List_iterator<bdPeer>::operator->(&local_48);
      pbVar6->mExtraFlags = uVar2 | pbVar6->mExtraFlags;
    }
    std::_List_iterator<bdPeer>::operator++(&local_48,0);
  }
  return true;
}

Assistant:

bool    bdSpace::flagpeer(const bdId *id, uint32_t flags, uint32_t ex_flags) {
#ifdef DEBUG_BD_SPACE
	fprintf(stderr, "bdSpace::flagpeer()\n");
#endif

	/* calculate metric */
	bdMetric met;
	mFns->bdDistance(&(mOwnId), &(id->id), &met);
	int bucket = mFns->bdBucketDistance(&met);


	/* select correct bucket */
	bdBucket &buck =  buckets[bucket];

	/* loop through ids, to find it */
	std::list<bdPeer>::iterator it;
	for (it = buck.entries.begin(); it != buck.entries.end(); it++) {
                /* similar id check */
		if (mFns->bdSimilarId(id, &(it->mPeerId))) {
#ifdef DEBUG_BD_SPACE
			fprintf(stderr, "peer:");
			mFns->bdPrintId(std::cerr, id);	
			fprintf(stderr, " bucket: %d", bucket);
			fprintf(stderr, "\n");
			fprintf(stderr, "Original Flags: %x Extra: %x\n", 
				it->mPeerFlags, it->mExtraFlags);
#endif
			it->mPeerFlags |= flags;
			it->mExtraFlags |= ex_flags;

#ifdef DEBUG_BD_SPACE
			fprintf(stderr, "Updated Flags: %x Extra: %x\n",
				it->mPeerFlags, it->mExtraFlags);
#endif
		}
	}
	return true;
}